

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.h
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChCoordsys<double>::TransformLocalToParent(ChCoordsys<double> *this,ChVector<double> *local)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ChVector<double> *v;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  dVar1 = (this->rot).m_data[0];
  dVar2 = (this->rot).m_data[1];
  dVar6 = dVar1 * dVar1;
  dVar3 = (this->rot).m_data[2];
  dVar4 = (this->rot).m_data[3];
  auVar17 = ZEXT816(0xbff0000000000000);
  auVar18 = ZEXT816(0x4000000000000000);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar6 + dVar2 * dVar2;
  auVar12 = vfmadd213sd_fma(auVar12,auVar18,auVar17);
  dVar7 = dVar2 * dVar3 - dVar1 * dVar4;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local->m_data[0];
  dVar5 = local->m_data[1];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar5 * (dVar7 + dVar7);
  auVar12 = vfmadd231sd_fma(auVar19,auVar20,auVar12);
  dVar7 = dVar1 * dVar3 + dVar2 * dVar4;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local->m_data[2];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar7 + dVar7;
  auVar12 = vfmadd213sd_fma(auVar13,auVar21,auVar12);
  dVar7 = dVar2 * dVar3 + dVar1 * dVar4;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar6 + dVar3 * dVar3;
  auVar13 = vfmadd213sd_fma(auVar15,auVar18,auVar17);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar7 + dVar7;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar5 * auVar13._0_8_;
  auVar13 = vfmadd231sd_fma(auVar16,auVar20,auVar8);
  dVar7 = dVar3 * dVar4 - dVar1 * dVar2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar7 + dVar7;
  auVar13 = vfmadd213sd_fma(auVar9,auVar21,auVar13);
  dVar7 = dVar2 * dVar4 - dVar1 * dVar3;
  dVar1 = dVar1 * dVar2 + dVar3 * dVar4;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar7 + dVar7;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar5 * (dVar1 + dVar1);
  auVar9 = vfmadd231sd_fma(auVar14,auVar20,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar6 + dVar4 * dVar4;
  auVar8 = vfmadd213sd_fma(auVar11,auVar18,auVar17);
  auVar8 = vfmadd213sd_fma(auVar8,auVar21,auVar9);
  v->m_data[0] = 0.0;
  v->m_data[1] = 0.0;
  v->m_data[2] = 0.0;
  v->m_data[0] = auVar12._0_8_ + (this->pos).m_data[0];
  v->m_data[1] = auVar13._0_8_ + (this->pos).m_data[1];
  v->m_data[2] = auVar8._0_8_ + (this->pos).m_data[2];
  return v;
}

Assistant:

ChVector<Real> TransformLocalToParent(const ChVector<Real>& local) const { return pos + rot.Rotate(local); }